

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

int traversearray(global_State *g,Table *h)

{
  uint uVar1;
  int iVar2;
  GCObject *o;
  ulong uVar3;
  
  uVar1 = h->asize;
  if ((ulong)uVar1 == 0) {
    iVar2 = 0;
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    do {
      if ((*(byte *)((long)h->array + uVar3 + 4) & 0x40) == 0) {
        o = (GCObject *)0x0;
      }
      else {
        o = h->array[-1 - uVar3].gc;
      }
      if ((o != (GCObject *)0x0) && ((o->marked & 0x18) != 0)) {
        reallymarkobject(g,o);
        iVar2 = 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar1);
  }
  return iVar2;
}

Assistant:

static int traversearray (global_State *g, Table *h) {
  unsigned asize = h->asize;
  int marked = 0;  /* true if some object is marked in this traversal */
  unsigned i;
  for (i = 0; i < asize; i++) {
    GCObject *o = gcvalarr(h, i);
    if (o != NULL && iswhite(o)) {
      marked = 1;
      reallymarkobject(g, o);
    }
  }
  return marked;
}